

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseComplexTerminal(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  Lexeme *pLVar2;
  _func_int **pp_Var3;
  int iVar4;
  SynBase *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar7;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_mul) {
    ctx->currentLexeme = begin + 1;
    pSVar5 = ParseTerminal(ctx);
    if (pSVar5 == (SynBase *)0x0) {
      anon_unknown.dwarf_1613e::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'*\'");
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
      pSVar5 = (SynBase *)CONCAT44(extraout_var,iVar4);
      SynBase::SynBase(pSVar5,0,ctx->currentLexeme,ctx->currentLexeme);
      pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_002283e8;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pSVar6 = (SynBase *)CONCAT44(extraout_var_00,iVar4);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00113f39:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    SynBase::SynBase(pSVar6,0x1e,begin,ctx->currentLexeme + -1);
    pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_00228810;
    pSVar6[1]._vptr_SynBase = (_func_int **)pSVar5;
  }
  else {
    if (ctx->currentLexeme->type == lex_oparen) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      if (0xff < ctx->expressionGroupDepth) {
        anon_unknown.dwarf_1613e::Stop
                  (ctx,ctx->currentLexeme,"ERROR: reached nested \'(\' limit of %d",0x100);
      }
      ctx->expressionGroupDepth = ctx->expressionGroupDepth + 1;
      pSVar6 = ParseAssignment(ctx);
      ctx->expressionGroupDepth = ctx->expressionGroupDepth - 1;
      if (pSVar6 == (SynBase *)0x0) {
        anon_unknown.dwarf_1613e::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after \'(\'");
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
        pSVar6 = (SynBase *)CONCAT44(extraout_var_01,iVar4);
        SynBase::SynBase(pSVar6,0,ctx->currentLexeme,ctx->currentLexeme);
        pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_002283e8;
      }
      anon_unknown.dwarf_1613e::CheckConsume
                (ctx,lex_cparen,"ERROR: closing \')\' not found after \'(\'");
    }
    else {
      pSVar6 = (SynBase *)0x0;
    }
    if (pSVar6 == (SynBase *)0x0) {
      pSVar6 = ParseString(ctx);
    }
    if (pSVar6 == (SynBase *)0x0) {
      pSVar6 = ParseArray(ctx);
    }
    if (pSVar6 == (SynBase *)0x0) {
      pSVar6 = ParseType(ctx,(bool *)0x0,false);
    }
    if (pSVar6 == (SynBase *)0x0) {
      pLVar2 = ctx->currentLexeme;
      if (pLVar2->type == lex_string) {
        pp_Var3 = (_func_int **)pLVar2->pos;
        uVar7 = pLVar2->length;
        ctx->currentLexeme = pLVar2 + 1;
        iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar6 = (SynBase *)CONCAT44(extraout_var_02,iVar4);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00113f39;
        SynBase::SynBase(pSVar6,4,begin,ctx->currentLexeme + -1);
        pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
        pSVar6[1]._vptr_SynBase = pp_Var3;
        *(ulong *)&pSVar6[1].typeID = (long)pp_Var3 + (ulong)uVar7;
      }
      else {
        pSVar6 = (SynBase *)0x0;
      }
    }
    if (pSVar6 == (SynBase *)0x0) {
      pLVar2 = ctx->currentLexeme;
      if (pLVar2->type == lex_at) {
        ctx->currentLexeme = pLVar2 + 1;
        uVar7 = pLVar2[1].type - lex_add;
        if (uVar7 < 0x23) {
          pSVar5 = (SynBase *)pLVar2[1].pos;
          uVar1 = pLVar2[1].length;
          if (pLVar2[1].type != lex_none) {
            ctx->currentLexeme = pLVar2 + 2;
          }
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          pSVar6 = (SynBase *)CONCAT44(extraout_var_03,iVar4);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00113f39;
          SynBase::SynBase(pSVar6,4,begin,ctx->currentLexeme + -1);
          pSVar6->_vptr_SynBase = (_func_int **)&PTR__SynBase_002282a0;
          pSVar6[1]._vptr_SynBase = (_func_int **)pSVar5;
          *(ulong *)&pSVar6[1].typeID = (long)&pSVar5->_vptr_SynBase + (ulong)uVar1;
        }
        else {
          pSVar6 = (SynBase *)0x0;
          anon_unknown.dwarf_1613e::Report(ctx,pLVar2 + 1,"ERROR: name expected after \'@\'");
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])();
          pSVar5 = (SynBase *)CONCAT44(extraout_var_04,iVar4);
          SynBase::SynBase(pSVar5,0,ctx->currentLexeme,ctx->currentLexeme);
          pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_002283e8;
        }
        if (0x22 < uVar7) {
          return pSVar5;
        }
      }
      else {
        pSVar6 = (SynBase *)0x0;
      }
    }
    if (pSVar6 != (SynBase *)0x0) {
      pSVar6 = ParsePostExpressions(ctx,pSVar6);
      return pSVar6;
    }
    pSVar6 = (SynBase *)0x0;
  }
  return pSVar6;
}

Assistant:

SynBase* ParseComplexTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_mul))
	{
		SynBase *node = ParseTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '*'");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynDereference>()) SynDereference(start, ctx.Previous(), node);
	}

	SynBase *node = NULL;

	if(ctx.Consume(lex_oparen))
	{
		const unsigned groupLimit = 256;

		if(ctx.expressionGroupDepth >= groupLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '(' limit of %d", groupLimit);

		ctx.expressionGroupDepth++;

		node = ParseAssignment(ctx);

		ctx.expressionGroupDepth--;

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '('");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after '('");
	}

	if(!node)
		node = ParseString(ctx);

	if(!node)
		node = ParseArray(ctx);

	if(!node)
		node = ParseType(ctx);

	if(!node && ctx.At(lex_string))
	{
		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node && ctx.Consume(lex_at))
	{
		bool isOperator = (ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot;

		if(!isOperator)
		{
			Report(ctx, ctx.Current(), "ERROR: name expected after '@'");

			return new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node)
		return NULL;
		
	return ParsePostExpressions(ctx, node);
}